

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O3

bool PIT_CheckThing(FMultiBlockThingsIterator *it,CheckResult *cres,FBoundingBox *box,
                   FCheckPosition *tm)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  AActor *other;
  VMFunction *pVVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  double dVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined8 uVar10;
  bool bVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  PClass *pPVar16;
  AActor *pAVar17;
  Node *pNVar18;
  Node *pNVar19;
  AActor *pAVar20;
  AActor *pAVar21;
  AActor *unaff_RBP;
  long lVar22;
  uint uVar23;
  FString *this;
  undefined8 *in_FS_OFFSET;
  undefined4 uVar24;
  uint uVar25;
  int retval;
  DVector3 oldpos;
  VMReturn ret;
  undefined1 local_cc [4];
  undefined1 local_c8 [44];
  char local_9c [4];
  DThinker *local_98;
  undefined1 local_90 [24];
  FName local_78;
  FName local_74;
  FName local_70;
  FName local_6c;
  FSoundID local_68;
  FName local_64;
  FName local_60;
  FName local_5c;
  DAngle local_58;
  DAngle local_50;
  DAngle local_48;
  DAngle local_40;
  DAngle local_38;
  PClass *pPVar15;
  undefined4 extraout_var_02;
  
  other = cres->thing;
  pAVar17 = tm->thing;
  if (other == pAVar17) {
    return true;
  }
  if ((((other->flags).Value & 7) == 0) && (((other->flags6).Value & 0x200) == 0)) {
    return true;
  }
  dVar7 = other->radius + pAVar17->radius;
  if (dVar7 <= ABS((other->__Pos).X - (cres->Position).X)) {
    return true;
  }
  if (dVar7 <= ABS((other->__Pos).Y - (cres->Position).Y)) {
    return true;
  }
  if ((((other->flags2).Value | (pAVar17->flags2).Value) >> 0x14 & 1) != 0) {
    return true;
  }
  if (((pAVar17->flags6).Value & 2) != 0) {
    unaff_RBP = (AActor *)local_c8;
    AActor::GetSpecies(unaff_RBP);
    AActor::GetSpecies((AActor *)local_90);
    if (local_c8._0_4_ == local_90._0_4_) {
      return true;
    }
    pAVar17 = tm->thing;
  }
  pAVar17->BlockingMobj = other;
  dVar7 = (other->__Pos).Z + other->Height;
  if ((cres->portalflags & 0x80) == 0) {
    if ((((((byte)i_compatflags & 0x10) == 0) && (((pAVar17->flags).Value & 0x1014200) == 0)) &&
        (((other->flags).Value & 2) != 0)) &&
       (((((other->flags4).Value & 0x80) != 0 && (((pAVar17->flags3).Value & 0x2000) != 0)) &&
        ((tm->floorz <= dVar7 && (dVar7 <= (pAVar17->__Pos).Z + pAVar17->MaxStepHeight)))))) {
      tm->stepthing = other;
      tm->floorz = dVar7;
    }
    if (((tm->FromPMove == false) && (pAVar17->player == (player_t *)0x0)) ||
       (((other->flags).Value & 2) == 0)) goto LAB_0040ad07;
    AActor::PosRelative((DVector3 *)local_c8,pAVar17,other);
    dVar2 = (tm->pos).X;
    pAVar17 = tm->thing;
    if ((dVar2 != (pAVar17->__Pos).X) || (NAN(dVar2) || NAN((pAVar17->__Pos).X))) {
LAB_0040ac14:
      dVar2 = (other->__Pos).X;
      dVar8 = other->radius + pAVar17->radius;
      if ((ABS(dVar2 - (double)local_c8._0_8_) < dVar8) &&
         (dVar3 = (other->__Pos).Y, ABS(dVar3 - (double)local_c8._8_8_) < dVar8)) {
        dVar2 = dVar2 - (cres->Position).X;
        dVar3 = dVar3 - (cres->Position).Y;
        local_98 = (DThinker *)c_sqrt(dVar3 * dVar3 + dVar2 * dVar2);
        dVar2 = (other->__Pos).X - (double)local_c8._0_8_;
        dVar8 = (other->__Pos).Y - (double)local_c8._8_8_;
        dVar2 = c_sqrt(dVar8 * dVar8 + dVar2 * dVar2);
        pAVar17 = tm->thing;
        if (dVar2 < (double)local_98) {
          dVar2 = (pAVar17->__Pos).Z;
          dVar8 = pAVar17->Height + dVar2;
          pdVar1 = &(other->__Pos).Z;
          if ((dVar8 < *pdVar1 || dVar8 == *pdVar1) ||
             (unaff_RBP = (AActor *)CONCAT71((int7)((ulong)unaff_RBP >> 8),1), dVar7 <= dVar2)) {
            unaff_RBP = (AActor *)
                        (ulong)(((other->flags3).Value & (pAVar17->flags3).Value) >> 8 & 1);
          }
          goto LAB_0040ad09;
        }
      }
      goto LAB_0040ad07;
    }
    dVar2 = (tm->pos).Y;
    unaff_RBP = (AActor *)CONCAT71((int7)((ulong)unaff_RBP >> 8),1);
    pdVar1 = &(pAVar17->__Pos).Y;
    if ((dVar2 != *pdVar1) || (NAN(dVar2) || NAN(*pdVar1))) goto LAB_0040ac14;
  }
  else {
LAB_0040ad07:
    unaff_RBP = (AActor *)0x0;
  }
LAB_0040ad09:
  uVar14 = (pAVar17->flags2).Value;
  if ((((((uVar14 >> 0xc & 1) != 0) || (((other->flags4).Value & 0x80) != 0)) &&
       (((byte)i_compatflags & 0x10) == 0)) &&
      ((((uVar14 >> 8 & 1) == 0 || (((pAVar17->flags).Value & 0x10000) == 0)) ||
       ((((other->flags5).Value & 0x80000) != 0 ||
        ((((pAVar17->flags6).Value & 1) != 0 && (((other->flags2).Value & 0x8000) != 0)))))))) &&
     ((((other->flags3).Value & (pAVar17->flags3).Value) >> 8 & 1) == 0)) {
    dVar2 = (pAVar17->__Pos).Z;
    if (dVar7 <= dVar2) {
      return true;
    }
    if (dVar2 + pAVar17->Height <= (other->__Pos).Z) {
      return true;
    }
  }
  if (((((other->flags).Value & 2) != 0) || (((other->flags6).Value & 0x220) != 0)) &&
     (((uVar14 & 8) != 0 || ((pAVar17->flags).Value & 0x10002) != 0 ||
      ((((pAVar17->flags6).Value & 0x80000) != 0 || (((pAVar17->BounceFlags).Value & 0x1000) != 0)))
      ))) {
    if (PIT_CheckThing::VIndex == 0xffffffff) {
      PIT_CheckThing::VIndex = GetVirtualIndex(AActor::RegistrationInfo.MyClass,"CanCollideWith");
      if (PIT_CheckThing::VIndex == 0xffffffff) {
        __assert_fail("VIndex != ~0u",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                      ,0x4f0,
                      "bool PIT_CheckThing(FMultiBlockThingsIterator &, FMultiBlockThingsIterator::CheckResult &, const FBoundingBox &, FCheckPosition &)"
                     );
      }
      pAVar17 = tm->thing;
    }
    local_c8._8_5_ = 0x300000001;
    local_c8._24_4_ = 1;
    local_c8[0x1c] = 3;
    local_c8._32_4_ = 0;
    local_9c[0] = 0;
    local_90._0_8_ = (AActor *)local_cc;
    local_90._8_2_ = 0;
    local_90[10] = '\0';
    pPVar15 = (pAVar17->super_DThinker).super_DObject.Class;
    local_c8._0_8_ = pAVar17;
    local_c8._16_8_ = other;
    if (pPVar15 == (PClass *)0x0) {
      iVar12 = (**(pAVar17->super_DThinker).super_DObject._vptr_DObject)(pAVar17);
      pPVar15 = (PClass *)CONCAT44(extraout_var,iVar12);
      (pAVar17->super_DThinker).super_DObject.Class = pPVar15;
    }
    local_98 = (DThinker *)CONCAT44(local_98._4_4_,(int)unaff_RBP);
    if ((PIT_CheckThing::VIndex < (pPVar15->Virtuals).Count) &&
       (pVVar4 = (pPVar15->Virtuals).Array[PIT_CheckThing::VIndex], pVVar4 != (VMFunction *)0x0)) {
      GlobalVMStack::__tls_init();
      VMFrameStack::Call((VMFrameStack *)*in_FS_OFFSET,pVVar4,(VMValue *)local_c8,3,
                         (VMReturn *)local_90,1,(VMException **)0x0);
      if (local_cc != (undefined1  [4])0x0) goto LAB_0040aecb;
LAB_0040af6a:
      bVar11 = false;
    }
    else {
LAB_0040aecb:
      uVar10 = local_c8._0_8_;
      local_c8._0_8_ = local_c8._16_8_;
      local_c8._16_8_ = uVar10;
      local_c8._32_4_ = 1;
      pPVar15 = (other->super_DThinker).super_DObject.Class;
      if (pPVar15 == (PClass *)0x0) {
        iVar12 = (**(other->super_DThinker).super_DObject._vptr_DObject)(other);
        pPVar15 = (PClass *)CONCAT44(extraout_var_00,iVar12);
        (other->super_DThinker).super_DObject.Class = pPVar15;
      }
      if ((PIT_CheckThing::VIndex < (pPVar15->Virtuals).Count) &&
         (pVVar4 = (pPVar15->Virtuals).Array[PIT_CheckThing::VIndex], pVVar4 != (VMFunction *)0x0))
      {
        GlobalVMStack::__tls_init();
        VMFrameStack::Call((VMFrameStack *)*in_FS_OFFSET,pVVar4,(VMValue *)local_c8,3,
                           (VMReturn *)local_90,1,(VMException **)0x0);
        if (local_cc == (undefined1  [4])0x0) goto LAB_0040af6a;
      }
      bVar11 = true;
    }
    lVar22 = -0x30;
    this = (FString *)(local_c8 + 0x20);
    do {
      if (*(char *)((long)&this[1].Chars + 4) == '\x02') {
        FString::~FString(this);
      }
      this = this + -2;
      lVar22 = lVar22 + 0x10;
    } while (lVar22 != 0);
    if (!bVar11) {
      return true;
    }
    pAVar17 = tm->thing;
    unaff_RBP = (AActor *)((ulong)local_98 & 0xffffffff);
  }
  if ((pAVar17->player == (player_t *)0x0) || ((pAVar17->player->cheats & 0x2000) == 0)) {
    uVar14 = (other->flags6).Value;
    if ((((uVar14 >> 9 & 1) == 0) || ((((pAVar17->flags).Value & 2) == 0 || (other->health < 1))))
       || (((uVar14 >> 0xd & 1) == 0 && (bVar11 = AActor::IsSentient(other), !bVar11)))) {
LAB_0040b148:
      uVar14 = (other->flags6).Value;
    }
    else {
      if (other->player == (player_t *)0x0) {
        pPVar15 = (other->super_DThinker).super_DObject.Class;
        if (pPVar15 == (PClass *)0x0) {
          iVar12 = (**(other->super_DThinker).super_DObject._vptr_DObject)(other);
          pPVar15 = (PClass *)CONCAT44(extraout_var_01,iVar12);
          (other->super_DThinker).super_DObject.Class = pPVar15;
        }
        pAVar17 = tm->thing;
        pPVar16 = (pAVar17->super_DThinker).super_DObject.Class;
        if (pPVar16 == (PClass *)0x0) {
          iVar12 = (**(pAVar17->super_DThinker).super_DObject._vptr_DObject)(pAVar17);
          pPVar16 = (PClass *)CONCAT44(extraout_var_02,iVar12);
          (pAVar17->super_DThinker).super_DObject.Class = pPVar16;
        }
        if (pPVar15 == pPVar16) goto LAB_0040b148;
      }
      if (((other->flags6).Value & 0x40) != 0) {
        AActor::GetSpecies((AActor *)local_c8);
        AActor::GetSpecies((AActor *)local_90);
        if (local_c8._0_4_ == local_90._0_4_) goto LAB_0040b148;
      }
      pAVar17 = tm->thing;
      dVar2 = (pAVar17->__Pos).Z;
      if ((dVar7 < dVar2) || (dVar2 + pAVar17->Height < (other->__Pos).Z)) goto LAB_0040b148;
      pAVar21 = (other->master).field_0.p;
      if (pAVar21 == (AActor *)0x0) {
LAB_0040b0c6:
        pAVar21 = (AActor *)0x0;
      }
      else if (((pAVar21->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
        (other->master).field_0.p = (AActor *)0x0;
        goto LAB_0040b0c6;
      }
      if (pAVar21 == pAVar17) goto LAB_0040b148;
      pAVar17 = (tm->thing->master).field_0.p;
      if (pAVar17 == (AActor *)0x0) {
LAB_0040b0ed:
        pAVar17 = (AActor *)0x0;
      }
      else if (((pAVar17->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
        (tm->thing->master).field_0.p = (AActor *)0x0;
        goto LAB_0040b0ed;
      }
      uVar14 = (other->flags6).Value;
      if (pAVar17 != other) {
        (other->flags6).Value = uVar14 & 0xffffdfff;
        local_5c.Index = 0;
        local_38.Degrees = 0.0;
        P_DamageMobj(other,(AActor *)0x0,(AActor *)0x0,other->health,&local_5c,8,&local_38);
        return true;
      }
    }
    if (((uVar14 & 0x20) != 0) &&
       ((((pAVar17 = tm->thing, pAVar17->player != (player_t *)0x0 ||
          (((other->activationtype & 8U) != 0 && (((pAVar17->flags3).Value & 0x2000) != 0)))) ||
         (((other->activationtype & 0x10U) != 0 && (((pAVar17->flags).Value & 0x10000) != 0)))) &&
        ((other->lastbump < level.maptime &&
         (bVar11 = P_ActivateThingSpecial(other,pAVar17,false), bVar11)))))) {
      other->lastbump = level.maptime + 0x23;
    }
  }
  pAVar17 = tm->thing;
  uVar14 = (pAVar17->flags).Value;
  if ((uVar14 >> 0x18 & 1) != 0) {
    bVar11 = AActor::CallSlam(pAVar17,pAVar17->BlockingMobj);
    tm->thing->BlockingMobj = (AActor *)0x0;
    return bVar11;
  }
  if ((pAVar17->player != (player_t *)0x0) && ((pAVar17->player->cheats & 0x2000) != 0)) {
    bVar11 = true;
    if (((other->flags).Value & 0x1002) == 2) {
      if ((uVar14 & 2) == 0) {
        bVar11 = ((pAVar17->flags6).Value & 0x80000) == 0;
      }
      else {
        bVar11 = false;
      }
    }
LAB_0040b50a:
    return (bool)((byte)unaff_RBP | bVar11);
  }
  uVar25 = (pAVar17->flags2).Value;
  if (((((uVar25 & 8) != 0) && (((other->flags).Value & 4) != 0)) &&
      (((other->flags2).Value & 0x8000) == 0)) && (((other->flags3).Value & 0x12000) == 0x2000)) {
    dVar7 = (other->Vel).X + (pAVar17->Vel).X;
    dVar2 = (other->Vel).Y + (pAVar17->Vel).Y;
    auVar9._8_4_ = SUB84(dVar2,0);
    auVar9._0_8_ = dVar7;
    auVar9._12_4_ = (int)((ulong)dVar2 >> 0x20);
    (other->Vel).X = dVar7;
    (other->Vel).Y = (double)auVar9._8_8_;
    if (ABS(dVar2) + ABS(dVar7) <= 3.0) {
      return false;
    }
    iVar12 = pAVar17->Mass / 100 + 1;
    local_60.Index = (pAVar17->DamageType).super_FName.Index;
    local_40.Degrees = 0.0;
    iVar13 = P_DamageMobj(other,pAVar17,pAVar17,iVar12,&local_60,0,&local_40);
    if (0 < iVar13) {
      iVar12 = iVar13;
    }
    P_TraceBleed(iVar12,other,tm->thing);
    iVar12 = other->Mass / 100 + 1;
    local_64.Index = (tm->thing->DamageType).super_FName.Index;
    local_48.Degrees = 0.0;
    iVar13 = P_DamageMobj(tm->thing,other,other,iVar12 >> 2,&local_64,0,&local_48);
    if (0 < iVar13) {
      iVar12 = iVar13;
    }
    P_TraceBleed(iVar12,tm->thing,other);
    return false;
  }
  if ((uVar14 >> 0x10 & 1) == 0) {
    uVar23 = (other->flags2).Value;
    if (((uVar14 & 2) != 0) || (((pAVar17->BounceFlags).Value & 0x1000) == 0)) {
      if (((uVar25 >> 0xd & 1) == 0 && (uVar23 >> 9 & 1) != 0) &&
         (iVar12 = tm->PushTime, other->lastpush != iVar12)) {
        dVar7 = (other->Vel).X + other->pushfactor * (pAVar17->Vel).X;
        dVar2 = (other->Vel).Y + other->pushfactor * (pAVar17->Vel).Y;
        auVar5._8_4_ = SUB84(dVar2,0);
        auVar5._0_8_ = dVar7;
        auVar5._12_4_ = (int)((ulong)dVar2 >> 0x20);
        (other->Vel).X = dVar7;
        (other->Vel).Y = (double)auVar5._8_8_;
        other->lastpush = iVar12;
      }
      uVar25 = (other->flags).Value;
      bVar11 = (uVar25 & 0x1002) != 2;
      if ((!bVar11) && ((uVar14 & 2) == 0)) {
        bVar11 = ((pAVar17->flags6).Value & 0x80000) == 0;
      }
      if (((uVar14 >> 0xb & 1) != 0 && (uVar25 & 1) != 0) &&
         (dVar7 = ((pAVar17->__Pos).Z + pAVar17->Height) - pAVar17->MaxStepHeight,
         pdVar1 = &(other->__Pos).Z, *pdVar1 <= dVar7 && dVar7 != *pdVar1)) {
        P_TouchSpecialThing(other,pAVar17);
      }
      goto LAB_0040b50a;
    }
  }
  else {
    uVar23 = (other->flags2).Value;
  }
  if ((uVar23 >> 0x1a & 1) != 0) {
    return true;
  }
  if (((uVar25 >> 0xe & 1) != 0) && (((other->flags3).Value & 8) != 0)) {
    return true;
  }
  if ((((pAVar17->flags6).Value & 4) != 0) &&
     (pAVar21 = (pAVar17->target).field_0.p, pAVar21 != (AActor *)0x0)) {
    if (((pAVar21->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
      AActor::GetSpecies((AActor *)local_c8);
      AActor::GetSpecies((AActor *)local_90);
      if (local_c8._0_4_ == local_90._0_4_) {
        return true;
      }
    }
    else {
      (pAVar17->target).field_0.p = (AActor *)0x0;
    }
  }
  uVar14 = (other->flags).Value;
  if ((((uVar14 >> 0x14 & 1) != 0) && ((uVar14 & 4) == 0)) &&
     (((tm->thing->flags2).Value & 0x100) != 0)) {
    return true;
  }
  dVar7 = other->projectilepassheight;
  uVar24 = SUB84(dVar7,0);
  uVar25 = (uint)((ulong)dVar7 >> 0x20);
  if (dVar7 <= 0.0) {
    if ((0.0 <= dVar7) || ((i_compatflags._2_1_ & 8) == 0)) {
      uVar24 = SUB84(other->Height,0);
      uVar25 = (uint)((ulong)other->Height >> 0x20);
    }
    else {
      uVar25 = uVar25 ^ 0x80000000;
    }
  }
  pAVar17 = tm->thing;
  dVar7 = (pAVar17->__Pos).Z;
  dVar2 = (other->__Pos).Z;
  if ((double)CONCAT44(uVar25,uVar24) + dVar2 < dVar7) {
    return true;
  }
  if (dVar7 + pAVar17->Height < dVar2) {
    return true;
  }
  if ((((pAVar17->BounceFlags).Value & 8) == 0) ||
     (((pAVar17->DamageVal != 0 || (pAVar17->DamageFunc != (VMFunction *)0x0)) &&
      (((pAVar17->flags).Value & 0x10000) != 0)))) {
    iVar12 = AActor::SpecialMissileHit(pAVar17,other);
    if (iVar12 == 0) {
      return false;
    }
    if (iVar12 == 1) {
      return true;
    }
    pAVar17 = (tm->thing->target).field_0.p;
    if (pAVar17 != (AActor *)0x0) {
      if (((pAVar17->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
        if (other == pAVar17) {
          return true;
        }
        bVar11 = CanAttackHurt(other,pAVar17);
        if (!bVar11) {
          return false;
        }
      }
      else {
        (tm->thing->target).field_0.p = (AActor *)0x0;
      }
    }
    uVar14 = (other->flags).Value;
    if ((uVar14 & 4) != 0) {
      if ((((other->flags4).Value & 0x40000) != 0) && (((tm->thing->flags4).Value & 0x40000) == 0))
      {
        return true;
      }
      if (tm->DoRipping == false) {
        pAVar17 = tm->thing;
      }
      else {
        pAVar17 = tm->thing;
        if ((((((other->flags5).Value & 0x80000) == 0) &&
             ((other->RipLevelMin < 1 || (other->RipLevelMin <= pAVar17->RipperLevel)))) &&
            ((other->RipLevelMax < 1 || (pAVar17->RipperLevel <= other->RipLevelMax)))) &&
           ((((pAVar17->flags6).Value & 1) == 0 || (((other->flags2).Value & 0x8000) == 0)))) {
          pNVar19 = (tm->LastRipped).Nodes + ((tm->LastRipped).Size - 1 & (uint)other);
          do {
            pNVar18 = pNVar19;
            if ((pNVar18 == (Node *)0x0) || (pNVar18->Next == (Node *)0x1)) goto LAB_0040b726;
            pNVar19 = pNVar18->Next;
          } while ((pNVar18->Pair).Key != other);
          if ((pNVar18->Pair).Value == false) {
LAB_0040b726:
            pNVar19 = TMap<AActor_*,_bool,_THashTraits<AActor_*>,_TValueTraits<bool>_>::GetNode
                                (&tm->LastRipped,other);
            (pNVar19->Pair).Value = true;
            if (((((other->flags).Value & 0x80000) == 0) &&
                (uVar14 = (other->flags2).Value, -1 < (int)uVar14)) &&
               ((uVar14 & 0x18000000) == 0 && ((tm->thing->flags3).Value & 0x8000000) == 0)) {
              P_RipperBlood(tm->thing,other);
            }
            pAVar17 = tm->thing;
            local_68.ID = S_FindSound("misc/ripslop");
            S_Sound(pAVar17,4,&local_68,1.0,1.001);
            pAVar17 = tm->thing;
            iVar12 = pAVar17->PoisonDamage;
            if (0 < iVar12) {
              iVar13 = pAVar17->PoisonDuration;
              pAVar21 = (pAVar17->target).field_0.p;
              pAVar20 = pAVar17;
              if (pAVar21 == (AActor *)0x0) {
                pAVar21 = (AActor *)0x0;
              }
              else if (((pAVar21->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
                (pAVar17->target).field_0.p = (AActor *)0x0;
                pAVar20 = tm->thing;
                iVar12 = pAVar20->PoisonDamage;
                iVar13 = pAVar20->PoisonDuration;
                pAVar21 = (AActor *)0x0;
              }
              local_6c.Index = (pAVar20->PoisonDamageType).super_FName.Index;
              P_PoisonMobj(other,pAVar17,pAVar21,iVar12,iVar13,pAVar20->PoisonPeriod,&local_6c);
              pAVar17 = tm->thing;
            }
            iVar12 = AActor::GetMissileDamage(pAVar17,3,2);
            pAVar17 = tm->thing;
            pAVar21 = (pAVar17->target).field_0.p;
            pAVar20 = pAVar17;
            if (pAVar21 == (AActor *)0x0) {
              pAVar21 = (AActor *)0x0;
            }
            else if (((pAVar21->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
              (pAVar17->target).field_0.p = (AActor *)0x0;
              pAVar21 = (AActor *)0x0;
              pAVar20 = tm->thing;
            }
            local_70.Index = (pAVar20->DamageType).super_FName.Index;
            local_50.Degrees = 0.0;
            iVar13 = P_DamageMobj(other,pAVar17,pAVar21,iVar12,&local_70,0,&local_50);
            if (((tm->thing->flags3).Value & 0x8000000) == 0) {
              if (0 < iVar13) {
                iVar12 = iVar13;
              }
              P_TraceBleed(iVar12,other,tm->thing);
            }
            if (((((other->flags2).Value & 0x200) != 0) &&
                (pAVar17 = tm->thing, ((pAVar17->flags2).Value & 0x2000) == 0)) &&
               (iVar12 = tm->PushTime, other->lastpush != iVar12)) {
              dVar7 = (other->Vel).X + other->pushfactor * (pAVar17->Vel).X;
              dVar2 = (other->Vel).Y + other->pushfactor * (pAVar17->Vel).Y;
              auVar6._8_4_ = SUB84(dVar2,0);
              auVar6._0_8_ = dVar7;
              auVar6._12_4_ = (int)((ulong)dVar2 >> 0x20);
              (other->Vel).X = dVar7;
              (other->Vel).Y = (double)auVar6._8_8_;
              other->lastpush = iVar12;
            }
          }
          if (spechit.Count != 0) {
            spechit.Count = 0;
            return true;
          }
          return true;
        }
      }
      iVar12 = pAVar17->PoisonDamage;
      if (0 < iVar12) {
        iVar13 = pAVar17->PoisonDuration;
        pAVar21 = (pAVar17->target).field_0.p;
        pAVar20 = pAVar17;
        if (pAVar21 == (AActor *)0x0) {
          pAVar21 = (AActor *)0x0;
        }
        else if (((pAVar21->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
          (pAVar17->target).field_0.p = (AActor *)0x0;
          pAVar20 = tm->thing;
          iVar12 = pAVar20->PoisonDamage;
          iVar13 = pAVar20->PoisonDuration;
          pAVar21 = (AActor *)0x0;
        }
        local_74.Index = (pAVar20->PoisonDamageType).super_FName.Index;
        P_PoisonMobj(other,pAVar17,pAVar21,iVar12,iVar13,pAVar20->PoisonPeriod,&local_74);
        pAVar17 = tm->thing;
      }
      iVar12 = AActor::GetMissileDamage
                         (pAVar17,(uint)(((pAVar17->flags4).Value >> 8 & 1) == 0) * 4 + 3,1);
      pAVar17 = tm->thing;
      if (((iVar12 < 1) && (((pAVar17->flags6).Value & 8) == 0)) &&
         (((pAVar17->flags7).Value & 0x400) == 0)) {
        P_GiveBody(other,-iVar12,0);
      }
      else {
        pAVar21 = (pAVar17->target).field_0.p;
        pAVar20 = pAVar17;
        if (pAVar21 == (AActor *)0x0) {
          pAVar21 = (AActor *)0x0;
        }
        else if (((pAVar21->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
          (pAVar17->target).field_0.p = (AActor *)0x0;
          pAVar21 = (AActor *)0x0;
          pAVar20 = tm->thing;
        }
        local_78.Index = (pAVar20->DamageType).super_FName.Index;
        local_58.Degrees = 0.0;
        iVar13 = P_DamageMobj(other,pAVar17,pAVar21,iVar12,&local_78,0,&local_58);
        if (0 < iVar12) {
          pAVar17 = tm->thing;
          if ((((((pAVar17->flags5).Value & 0x100) != 0) && (((other->flags).Value & 0x80000) == 0))
              && (((other->flags2).Value & 0x98000000) == 0)) &&
             (((pAVar17->flags3).Value & 0x8000000) == 0)) {
            uVar14 = FRandom::GenRand32(&pr_checkthing);
            pAVar17 = tm->thing;
            if ((~uVar14 & 0xc0) != 0) {
              local_c8._0_8_ = (pAVar17->__Pos).X;
              local_c8._8_8_ = (pAVar17->__Pos).Y;
              local_c8._16_8_ = (pAVar17->__Pos).Z;
              AActor::AngleTo((AActor *)(local_90 + 0x10),pAVar17,SUB81(other,0));
              P_BloodSplatter((DVector3 *)local_c8,other,(DAngle *)(local_90 + 0x10));
              pAVar17 = tm->thing;
            }
          }
          if (((pAVar17->flags3).Value & 0x8000000) == 0) {
            if (0 < iVar13) {
              iVar12 = iVar13;
            }
            P_TraceBleed(iVar12,other,pAVar17);
          }
        }
      }
      if (((other->flags7).Value & 0x800) == 0) {
        return false;
      }
      if (-1 < (int)(other->flags2).Value) {
        return false;
      }
      pAVar17 = tm->thing;
      if (((pAVar17->flags).Value & 0x10000) == 0) {
        return false;
      }
      if (((pAVar17->flags2).Value & 0x40000000) != 0) {
        (pAVar17->tracer).field_0 = (pAVar17->target).field_0;
        pAVar17 = tm->thing;
      }
      (pAVar17->target).field_0.p = other;
      return true;
    }
    goto LAB_0040b661;
  }
  pAVar21 = (pAVar17->target).field_0.p;
  if (pAVar21 == (AActor *)0x0) {
LAB_0040b63f:
    pAVar21 = (AActor *)0x0;
  }
  else if (((pAVar21->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
    (pAVar17->target).field_0.p = (AActor *)0x0;
    goto LAB_0040b63f;
  }
  if (pAVar21 == other) {
    return true;
  }
LAB_0040b661:
  return (uVar14 & 2) == 0;
}

Assistant:

bool PIT_CheckThing(FMultiBlockThingsIterator &it, FMultiBlockThingsIterator::CheckResult &cres, const FBoundingBox &box, FCheckPosition &tm)
{
	AActor *thing = cres.thing;
	double topz;
	bool 	solid;
	int 	damage;

	// don't clip against self
	if (thing == tm.thing)
		return true;

	if (!((thing->flags & (MF_SOLID | MF_SPECIAL | MF_SHOOTABLE)) || thing->flags6 & MF6_TOUCHY))
		return true;	// can't hit thing

	double blockdist = thing->radius + tm.thing->radius;
	if (fabs(thing->X() - cres.Position.X) >= blockdist || fabs(thing->Y() - cres.Position.Y) >= blockdist)
		return true;

	if ((thing->flags2 | tm.thing->flags2) & MF2_THRUACTORS)
		return true;

	if ((tm.thing->flags6 & MF6_THRUSPECIES) && (tm.thing->GetSpecies() == thing->GetSpecies()))
		return true;

	tm.thing->BlockingMobj = thing;
	topz = thing->Top();

	// Both things overlap in x or y direction
	bool unblocking = false;

	// walking on other actors and unblocking is too messy through restricted portal types so disable it.
	if (!(cres.portalflags & FFCF_RESTRICTEDPORTAL))
	{
		if (!(i_compatflags & COMPATF_NO_PASSMOBJ) && !(tm.thing->flags & (MF_FLOAT | MF_MISSILE | MF_SKULLFLY | MF_NOGRAVITY)) &&
			(thing->flags & MF_SOLID) && (thing->flags4 & MF4_ACTLIKEBRIDGE))
		{
			// [RH] Let monsters walk on actors as well as floors
			if ((tm.thing->flags3 & MF3_ISMONSTER) &&
				topz >= tm.floorz && topz <= tm.thing->Z() + tm.thing->MaxStepHeight)
			{
				// The commented-out if is an attempt to prevent monsters from walking off a
				// thing further than they would walk off a ledge. I can't think of an easy
				// way to do this, so I restrict them to only walking on bridges instead.
				// Uncommenting the if here makes it almost impossible for them to walk on
				// anything, bridge or otherwise.
				//			if (abs(thing->x - tmx) <= thing->radius &&
				//				abs(thing->y - tmy) <= thing->radius)
				{
					tm.stepthing = thing;
					tm.floorz = topz;
				}
			}
		}

		if (((tm.FromPMove || tm.thing->player != NULL) && thing->flags&MF_SOLID))
		{
			DVector3 oldpos = tm.thing->PosRelative(thing);
			// Both actors already overlap. To prevent them from remaining stuck allow the move if it
			// takes them further apart or the move does not change the position (when called from P_ChangeSector.)
			if (tm.pos.X == tm.thing->X() && tm.pos.Y == tm.thing->Y())
			{
				unblocking = true;
			}
			else if (fabs(thing->X() - oldpos.X) < (thing->radius + tm.thing->radius) &&
				fabs(thing->Y() - oldpos.Y) < (thing->radius + tm.thing->radius))

			{
				double newdist = thing->Distance2D(cres.Position.X, cres.Position.Y);
				double olddist = thing->Distance2D(oldpos.X, oldpos.Y);

				if (newdist > olddist)
				{
					// unblock only if there's already a vertical overlap (or both actors are flagged not to overlap)
					unblocking = (tm.thing->Top() > thing->Z() && tm.thing->Z() < topz) || (tm.thing->flags3 & thing->flags3 & MF3_DONTOVERLAP);
				}
			}
		}
	}

	// [RH] If the other thing is a bridge, then treat the moving thing as if it had MF2_PASSMOBJ, so
	// you can use a scrolling floor to move scenery items underneath a bridge.
	if ((tm.thing->flags2 & MF2_PASSMOBJ || thing->flags4 & MF4_ACTLIKEBRIDGE) && !(i_compatflags & COMPATF_NO_PASSMOBJ))
	{ // check if a mobj passed over/under another object
		if (!(tm.thing->flags & MF_MISSILE) ||
			!(tm.thing->flags2 & MF2_RIP) ||
			(thing->flags5 & MF5_DONTRIP) ||
			((tm.thing->flags6 & MF6_NOBOSSRIP) && (thing->flags2 & MF2_BOSS)))
		{
			// Some things prefer not to overlap each other, if possible (Q: Is this even needed anymore? It was just for dealing with some deficiencies in the code below in Heretic.)
			if (!(tm.thing->flags3 & thing->flags3 & MF3_DONTOVERLAP))
			{
				if ((tm.thing->Z() >= topz) || (tm.thing->Top() <= thing->Z()))
					return true;
			}
			// If they are not allowed to overlap, the rest of this function still needs to be executed.
		}
	}

	// Call the script callback. This must be done before any other checks that perform some actual action or may already return a 'block'.
	// The checks here are to do this only for conditions that would later result in an action, calling this for everything would be too much of a drag if
	// too many scripted overrides were being used, as PIT_CheckThing is even called for touching all the monster corpses lying around.
	if (((thing->flags & MF_SOLID) || (thing->flags6 & (MF6_TOUCHY | MF6_BUMPSPECIAL))) && 
		((tm.thing->flags & (MF_SOLID|MF_MISSILE)) || (tm.thing->flags2 & MF2_BLASTED) || (tm.thing->flags6 & MF6_BLOCKEDBYSOLIDACTORS) || (tm.thing->BounceFlags & BOUNCE_MBF)))
	{
		static unsigned VIndex = ~0u;
		if (VIndex == ~0u)
		{
			VIndex = GetVirtualIndex(RUNTIME_CLASS(AActor), "CanCollideWith");
			assert(VIndex != ~0u);
		}

		VMValue params[3] = { tm.thing, thing, false };
		VMReturn ret;
		int retval;
		ret.IntAt(&retval);

		auto clss = tm.thing->GetClass();
		VMFunction *func = clss->Virtuals.Size() > VIndex ? clss->Virtuals[VIndex] : nullptr;
		if (func != nullptr)
		{
			GlobalVMStack.Call(func, params, 3, &ret, 1, nullptr);
			if (!retval) return true;
		}
		std::swap(params[0].a, params[1].a);
		params[2].i = true;

		// re-get for the other actor.
		clss = thing->GetClass();
		func = clss->Virtuals.Size() > VIndex ? clss->Virtuals[VIndex] : nullptr;
		if (func != nullptr)
		{
			GlobalVMStack.Call(func, params, 3, &ret, 1, nullptr);
			if (!retval) return true;
		}
	}


	if (tm.thing->player == NULL || !(tm.thing->player->cheats & CF_PREDICTING))
	{
		// touchy object is alive, toucher is solid
		if (thing->flags6 & MF6_TOUCHY && tm.thing->flags & MF_SOLID && thing->health > 0 &&
			// Thing is an armed mine or a sentient thing
			(thing->flags6 & MF6_ARMED || thing->IsSentient()) &&
			// either different classes or players
			(thing->player || thing->GetClass() != tm.thing->GetClass()) &&
			// or different species if DONTHARMSPECIES
			(!(thing->flags6 & MF6_DONTHARMSPECIES) || thing->GetSpecies() != tm.thing->GetSpecies()) &&
			// touches vertically
			topz >= tm.thing->Z() && tm.thing->Top() >= thing->Z() &&
			// prevents lost souls from exploding when fired by pain elementals
			(thing->master != tm.thing && tm.thing->master != thing))
			// Difference with MBF: MBF hardcodes the LS/PE check and lets actors of the same species
			// but different classes trigger the touchiness, but that seems less straightforwards.
		{
			thing->flags6 &= ~MF6_ARMED; // Disarm
			P_DamageMobj(thing, NULL, NULL, thing->health, NAME_None, DMG_FORCED);  // kill object
			return true;
		}

		// Check for MF6_BUMPSPECIAL
		// By default, only players can activate things by bumping into them
		if ((thing->flags6 & MF6_BUMPSPECIAL) && ((tm.thing->player != NULL)
			|| ((thing->activationtype & THINGSPEC_MonsterTrigger) && (tm.thing->flags3 & MF3_ISMONSTER))
			|| ((thing->activationtype & THINGSPEC_MissileTrigger) && (tm.thing->flags & MF_MISSILE))
			) && (level.maptime > thing->lastbump)) // Leave the bumper enough time to go away
		{
			if (P_ActivateThingSpecial(thing, tm.thing))
				thing->lastbump = level.maptime + TICRATE;
		}
	}

	// Check for skulls slamming into things
	if (tm.thing->flags & MF_SKULLFLY)
	{
		bool res = tm.thing->CallSlam(tm.thing->BlockingMobj);
		tm.thing->BlockingMobj = NULL;
		return res;
	}

	// [ED850] Player Prediction ends here. There is nothing else they could/should do.
	if (tm.thing->player != NULL && (tm.thing->player->cheats & CF_PREDICTING))
	{
		solid = (thing->flags & MF_SOLID) &&
			!(thing->flags & MF_NOCLIP) &&
			((tm.thing->flags & MF_SOLID) || (tm.thing->flags6 & MF6_BLOCKEDBYSOLIDACTORS));

		return !solid || unblocking;
	}

	// Check for blasted thing running into another
	if ((tm.thing->flags2 & MF2_BLASTED) && (thing->flags & MF_SHOOTABLE))
	{
		if (!(thing->flags2 & MF2_BOSS) && (thing->flags3 & MF3_ISMONSTER) && !(thing->flags3 & MF3_DONTBLAST))
		{
			// ideally this should take the mass factor into account
			thing->Vel += tm.thing->Vel.XY();
			if (fabs(thing->Vel.X) + fabs(thing->Vel.Y) > 3.)
			{
				int newdam;
				damage = (tm.thing->Mass / 100) + 1;
				newdam = P_DamageMobj(thing, tm.thing, tm.thing, damage, tm.thing->DamageType);
				P_TraceBleed(newdam > 0 ? newdam : damage, thing, tm.thing);
				damage = (thing->Mass / 100) + 1;
				newdam = P_DamageMobj(tm.thing, thing, thing, damage >> 2, tm.thing->DamageType);
				P_TraceBleed(newdam > 0 ? newdam : damage, tm.thing, thing);
			}
			return false;
		}
	}
	// Check for missile or non-solid MBF bouncer
	if (tm.thing->flags & MF_MISSILE || ((tm.thing->BounceFlags & BOUNCE_MBF) && !(tm.thing->flags & MF_SOLID)))
	{
		// Check for a non-shootable mobj
		if (thing->flags2 & MF2_NONSHOOTABLE)
		{
			return true;
		}
		// Check for passing through a ghost
		if ((thing->flags3 & MF3_GHOST) && (tm.thing->flags2 & MF2_THRUGHOST))
		{
			return true;
		}

		if ((tm.thing->flags6 & MF6_MTHRUSPECIES)
			&& tm.thing->target // NULL pointer check
			&& (tm.thing->target->GetSpecies() == thing->GetSpecies()))
			return true;

		// Check for rippers passing through corpses
		if ((thing->flags & MF_CORPSE) && (tm.thing->flags2 & MF2_RIP) && !(thing->flags & MF_SHOOTABLE))
		{
			return true;
		}

		double clipheight;

		if (thing->projectilepassheight > 0)
		{
			clipheight = thing->projectilepassheight;
		}
		else if (thing->projectilepassheight < 0 && (i_compatflags & COMPATF_MISSILECLIP))
		{
			clipheight = -thing->projectilepassheight;
		}
		else
		{
			clipheight = thing->Height;
		}

		// Check if it went over / under
		if (tm.thing->Z() > thing->Z() + clipheight)
		{ // Over thing
			return true;
		}
		if (tm.thing->Top() < thing->Z())
		{ // Under thing
			return true;
		}

		// [RH] What is the point of this check, again? In Hexen, it is unconditional,
		// but here we only do it if the missile's damage is 0.
		// MBF bouncer might have a non-0 damage value, but they must not deal damage on impact either.
		if ((tm.thing->BounceFlags & BOUNCE_Actors) && (tm.thing->IsZeroDamage() || !(tm.thing->flags & MF_MISSILE)))
		{
			return (tm.thing->target == thing || !(thing->flags & MF_SOLID));
		}

		switch (tm.thing->SpecialMissileHit(thing))
		{
		case 0:		return false;
		case 1:		return true;
		default:	break;
		}

		// [RH] Extend DeHacked infighting to allow for monsters
		// to never fight each other

		if (tm.thing->target != NULL)
		{
			if (thing == tm.thing->target)
			{ // Don't missile self
				return true;
			}

			if (!CanAttackHurt(thing, tm.thing->target))
			{
				return false;
			}
		}
		if (!(thing->flags & MF_SHOOTABLE))
		{ // Didn't do any damage
			return !(thing->flags & MF_SOLID);
		}
		if ((thing->flags4 & MF4_SPECTRAL) && !(tm.thing->flags4 & MF4_SPECTRAL))
		{
			return true;
		}

		if ((tm.DoRipping && !(thing->flags5 & MF5_DONTRIP)) && CheckRipLevel(thing, tm.thing))
		{
			if (!(tm.thing->flags6 & MF6_NOBOSSRIP) || !(thing->flags2 & MF2_BOSS))
			{
				bool *check = tm.LastRipped.CheckKey(thing);
				if (check == NULL || !*check)
				{
					tm.LastRipped[thing] = true;
					if (!(thing->flags & MF_NOBLOOD) &&
						!(thing->flags2 & MF2_REFLECTIVE) &&
						!(tm.thing->flags3 & MF3_BLOODLESSIMPACT) &&
						!(thing->flags2 & (MF2_INVULNERABLE | MF2_DORMANT)))
					{ // Ok to spawn blood
						P_RipperBlood(tm.thing, thing);
					}
					S_Sound(tm.thing, CHAN_BODY, "misc/ripslop", 1, ATTN_IDLE);

					// Do poisoning (if using new style poison)
					if (tm.thing->PoisonDamage > 0 && tm.thing->PoisonDuration != INT_MIN)
					{
						P_PoisonMobj(thing, tm.thing, tm.thing->target, tm.thing->PoisonDamage, tm.thing->PoisonDuration, tm.thing->PoisonPeriod, tm.thing->PoisonDamageType);
					}

					damage = tm.thing->GetMissileDamage(3, 2);
					int newdam = P_DamageMobj(thing, tm.thing, tm.thing->target, damage, tm.thing->DamageType);
					if (!(tm.thing->flags3 & MF3_BLOODLESSIMPACT))
					{
						P_TraceBleed(newdam > 0 ? newdam : damage, thing, tm.thing);
					}
					if (thing->flags2 & MF2_PUSHABLE
						&& !(tm.thing->flags2 & MF2_CANNOTPUSH))
					{ // Push thing
						if (thing->lastpush != tm.PushTime)
						{
							thing->Vel += tm.thing->Vel.XY() * thing->pushfactor;
							thing->lastpush = tm.PushTime;
						}
					}
				}
				spechit.Clear();
				return true;
			}
		}

		// Do poisoning (if using new style poison)
		if (tm.thing->PoisonDamage > 0 && tm.thing->PoisonDuration != INT_MIN)
		{
			P_PoisonMobj(thing, tm.thing, tm.thing->target, tm.thing->PoisonDamage, tm.thing->PoisonDuration, tm.thing->PoisonPeriod, tm.thing->PoisonDamageType);
		}

		// Do damage
		damage = tm.thing->GetMissileDamage((tm.thing->flags4 & MF4_STRIFEDAMAGE) ? 3 : 7, 1);
		if ((damage > 0) || (tm.thing->flags6 & MF6_FORCEPAIN) || (tm.thing->flags7 & MF7_CAUSEPAIN))
		{
			int newdam = P_DamageMobj(thing, tm.thing, tm.thing->target, damage, tm.thing->DamageType);
			if (damage > 0)
			{
				if ((tm.thing->flags5 & MF5_BLOODSPLATTER) &&
					!(thing->flags & MF_NOBLOOD) &&
					!(thing->flags2 & MF2_REFLECTIVE) &&
					!(thing->flags2 & (MF2_INVULNERABLE | MF2_DORMANT)) &&
					!(tm.thing->flags3 & MF3_BLOODLESSIMPACT) &&
					(pr_checkthing() < 192))
				{
					P_BloodSplatter(tm.thing->Pos(), thing, tm.thing->AngleTo(thing));
				}
				if (!(tm.thing->flags3 & MF3_BLOODLESSIMPACT))
				{
					P_TraceBleed(newdam > 0 ? newdam : damage, thing, tm.thing);
				}
			}
		}
		else
		{
			P_GiveBody(thing, -damage);
		}

		if ((thing->flags7 & MF7_THRUREFLECT) && (thing->flags2 & MF2_REFLECTIVE) && (tm.thing->flags & MF_MISSILE))
		{
			if (tm.thing->flags2 & MF2_SEEKERMISSILE)
			{
				tm.thing->tracer = tm.thing->target;
			}
			tm.thing->target = thing;
			return true;
		}
		return false;		// don't traverse any more
	}
	if (thing->flags2 & MF2_PUSHABLE && !(tm.thing->flags2 & MF2_CANNOTPUSH))
	{ // Push thing
		if (thing->lastpush != tm.PushTime)
		{
			thing->Vel += tm.thing->Vel.XY() * thing->pushfactor;
			thing->lastpush = tm.PushTime;
		}
	}
	solid = (thing->flags & MF_SOLID) &&
		!(thing->flags & MF_NOCLIP) &&
		((tm.thing->flags & MF_SOLID) || (tm.thing->flags6 & MF6_BLOCKEDBYSOLIDACTORS));

	// Check for special pickup
	if ((thing->flags & MF_SPECIAL) && (tm.thing->flags & MF_PICKUP)
		// [RH] The next condition is to compensate for the extra height
		// that gets added by P_CheckPosition() so that you cannot pick
		// up things that are above your true height.
		&& thing->Z() < tm.thing->Top() - tm.thing->MaxStepHeight)
	{ // Can be picked up by tmthing
		P_TouchSpecialThing(thing, tm.thing);	// can remove thing
	}

	// killough 3/16/98: Allow non-solid moving objects to move through solid
	// ones, by allowing the moving thing (tmthing) to move if it's non-solid,
	// despite another solid thing being in the way.
	// killough 4/11/98: Treat no-clipping things as not blocking

	return !solid || unblocking;

	// return !(thing->flags & MF_SOLID);	// old code -- killough
}